

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O1

bool __thiscall
helics::ForwardingTimeCoordinator::updateTimeFactors(ForwardingTimeCoordinator *this)

{
  TimeDependencies *dependencies;
  int iVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  TimeData *pTVar5;
  TimeData *pTVar6;
  byte bVar7;
  ActionMessage upd;
  TimeData mTimeDownstream;
  TimeData mTimeUpstream;
  DependencyInfo dependency;
  TimeData td;
  ActionMessage upd_delayed;
  ActionMessage local_2c8;
  TimeData local_210;
  TimeData local_1c8;
  TimeData local_180;
  undefined4 local_138;
  undefined8 local_134;
  TimeData local_128;
  undefined1 local_e0 [16];
  Time TStack_d0;
  Time local_c8;
  Time TStack_c0;
  Time local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  Time local_a8;
  int32_t aiStack_a0 [2];
  byte local_98 [112];
  
  bVar7 = 0;
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeUpstream
            (&local_1c8,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
             (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
             (GlobalFederateId)0x8831d580,(this->super_BaseTimeCoordinator).sequenceCounter);
  if ((this->super_BaseTimeCoordinator).noParent == true) {
    pTVar5 = &local_1c8;
    pTVar6 = &local_210;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pTVar6->next).internalTimeCode = (pTVar5->next).internalTimeCode;
      pTVar5 = (TimeData *)((long)pTVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pTVar6 = (TimeData *)((long)pTVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
  }
  else {
    generateMinTimeDownstream
              (&local_210,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
               (GlobalFederateId)0x8831d580,(this->super_BaseTimeCoordinator).sequenceCounter);
  }
  if ((local_1c8.mTimeState < 4) && ((this->super_BaseTimeCoordinator).executionMode != false)) {
    bVar4 = false;
  }
  else {
    bVar4 = TimeData::update(&(this->upstream).super_TimeData,&local_1c8);
  }
  if ((local_210.mTimeState < 4) && ((this->super_BaseTimeCoordinator).executionMode != false)) {
    bVar2 = false;
  }
  else {
    bVar2 = TimeData::update(&(this->downstream).super_TimeData,&local_210);
  }
  if ((this->upstream).super_TimeData.mTimeState == time_requested) {
    lVar3 = (this->upstream).super_TimeData.minDe.internalTimeCode;
    if (lVar3 < (this->downstream).super_TimeData.minDe.internalTimeCode) {
      (this->downstream).super_TimeData.minDe.internalTimeCode = lVar3;
    }
    lVar3 = (this->upstream).super_TimeData.Te.internalTimeCode;
    if (lVar3 < (this->downstream).super_TimeData.Te.internalTimeCode) {
      (this->downstream).super_TimeData.Te.internalTimeCode = lVar3;
    }
  }
  (this->super_BaseTimeCoordinator).sequenceCounter =
       this->sequenceModifier + (this->upstream).super_TimeData.sequenceCounter;
  bVar4 = (bool)(bVar4 | bVar2);
  if (bVar4 == true) {
    BaseTimeCoordinator::generateTimeRequest
              (&local_2c8,&this->super_BaseTimeCoordinator,&(this->upstream).super_TimeData,
               (GlobalFederateId)0x8831d580,(this->upstream).super_TimeData.responseSequenceCounter)
    ;
    if (local_2c8.messageAction != cmd_ignore) {
      transmitTimingMessagesUpstream(this,&local_2c8);
    }
    ActionMessage::~ActionMessage(&local_2c8);
  }
  iVar1 = (this->super_BaseTimeCoordinator).dependencies.mDelayedDependency.gid;
  if (bVar2 == false) {
    if (iVar1 == -2010000000) {
      return bVar4;
    }
    if (iVar1 == -1700000000) {
      return bVar4;
    }
    if (local_210.minFed.gid != iVar1) {
      return bVar4;
    }
    if ((this->super_BaseTimeCoordinator).executionMode != true) {
      return bVar4;
    }
    generateMinTimeUpstream
              (&local_180,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,local_210.minFed,0)
    ;
    local_e0._0_8_ = -1;
    local_e0._8_8_ = 0;
    TStack_d0.internalTimeCode = 0;
    local_c8.internalTimeCode = 0;
    TStack_c0.internalTimeCode = 0;
    local_b8.internalTimeCode = -0x77ce2a7f77ce2a80;
    local_b0._0_1_ = initialized;
    local_b0._1_1_ = false;
    local_b0._2_1_ = false;
    local_b0._3_1_ = false;
    local_ac._0_1_ = -2;
    local_ac._1_1_ = '\0';
    local_a8.internalTimeCode = 0;
    aiStack_a0 = (int32_t  [2])0x0;
    local_98[0] = 0x80;
    local_98[1] = 0xd5;
    local_98[2] = 0x31;
    local_98[3] = 0x88;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_98[8] = 0;
    local_98[9] = 0;
    local_98[10] = 0;
    local_98[0xb] = 0;
    TimeData::update((TimeData *)local_e0,&local_180);
    BaseTimeCoordinator::generateTimeRequest
              (&local_2c8,&this->super_BaseTimeCoordinator,(TimeData *)local_e0,local_210.minFed,
               aiStack_a0[0]);
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_2c8);
    }
  }
  else if (((iVar1 == -2010000000) || (iVar1 == -1700000000)) ||
          ((this->downstream).super_TimeData.minFed.gid != iVar1)) {
    BaseTimeCoordinator::generateTimeRequest
              (&local_2c8,&this->super_BaseTimeCoordinator,&(this->downstream).super_TimeData,
               (GlobalFederateId)0x8831d580,0);
    if (local_2c8.messageAction != cmd_ignore) {
      transmitTimingMessagesDownstream(this,&local_2c8,(GlobalFederateId)0x8831d580);
    }
  }
  else {
    BaseTimeCoordinator::generateTimeRequest
              (&local_2c8,&this->super_BaseTimeCoordinator,&(this->downstream).super_TimeData,
               (GlobalFederateId)0x8831d580,0);
    if (local_2c8.messageAction != cmd_ignore) {
      transmitTimingMessagesDownstream
                (this,&local_2c8,(GlobalFederateId)(this->downstream).super_TimeData.minFed.gid);
    }
    generateMinTimeUpstream
              (&local_128,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
               (GlobalFederateId)(this->downstream).super_TimeData.minFed.gid,0);
    local_180.next.internalTimeCode = -1;
    local_180.Te.internalTimeCode = 0;
    local_180.minDe.internalTimeCode = 0;
    local_180.TeAlt.internalTimeCode = 0;
    local_180.lastGrant.internalTimeCode = 0;
    local_180.minFed.gid = -2010000000;
    local_180.minFedActual.gid = -2010000000;
    local_180.mTimeState = initialized;
    local_180.hasData = false;
    local_180.interrupted = false;
    local_180.delayedTiming = false;
    local_180.timingVersion = -2;
    local_180.restrictionLevel = '\0';
    local_180.timeoutCount = 0;
    local_180.sequenceCounter = 0;
    local_180.responseSequenceCounter = 0;
    local_180.grantedIteration = 0;
    local_138 = 0x8831d580;
    local_134 = 0;
    TimeData::update(&local_180,&local_128);
    BaseTimeCoordinator::generateTimeRequest
              ((ActionMessage *)local_e0,&this->super_BaseTimeCoordinator,&local_180,
               (GlobalFederateId)(this->downstream).super_TimeData.minFed.gid,
               local_180.responseSequenceCounter);
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,
                 (ActionMessage *)local_e0);
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_e0);
  }
  ActionMessage::~ActionMessage(&local_2c8);
  return bVar4;
}

Assistant:

bool ForwardingTimeCoordinator::updateTimeFactors()
{
    auto mTimeUpstream = generateMinTimeUpstream(
        dependencies, restrictive_time_policy, mSourceId, NoIgnoredFederates, sequenceCounter);
    auto mTimeDownstream = (noParent) ? mTimeUpstream :
                                        generateMinTimeDownstream(dependencies,
                                                                  restrictive_time_policy,
                                                                  mSourceId,
                                                                  NoIgnoredFederates,
                                                                  sequenceCounter);

    bool updateUpStream{false};
    bool updateDownStream{false};
    if (mTimeUpstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateUpStream = upstream.update(mTimeUpstream);
    }
    if (mTimeDownstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateDownStream = downstream.update(mTimeDownstream);
    }

    if (upstream.mTimeState == TimeState::time_requested) {
        if (upstream.minDe < downstream.minDe) {
            downstream.minDe = upstream.minDe;
        }
        if (upstream.Te < downstream.Te) {
            downstream.Te = upstream.Te;
        }
    }
    if (!restrictive_time_policy && upstream.minDe < Time::maxVal()) {
        if (downstream.minDe > downstream.next) {
            //     downstream.next = downstream.minminDe;
        }
    }

    sequenceCounter = upstream.sequenceCounter + sequenceModifier;
    if (updateUpStream || updateDownStream) {
        auto upd =
            generateTimeRequest(upstream, GlobalFederateId{}, upstream.responseSequenceCounter);
        if (upd.action() != CMD_IGNORE) {
            transmitTimingMessagesUpstream(upd);
        }
    }
    if (updateDownStream) {
        if (dependencies.hasDelayedDependency() &&
            downstream.minFed == dependencies.delayedDependency()) {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd, downstream.minFed);
            }
            auto td = generateMinTimeUpstream(
                dependencies, restrictive_time_policy, mSourceId, downstream.minFed, 0);
            DependencyInfo dependency;
            dependency.update(td);
            auto upd_delayed = generateTimeRequest(dependency,
                                                   downstream.minFed,
                                                   dependency.responseSequenceCounter);
            if (sendMessageFunction) {
                sendMessageFunction(upd_delayed);
            }
        } else {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd);
            }
        }
    } else if (dependencies.hasDelayedDependency() &&
               mTimeDownstream.minFed == dependencies.delayedDependency() && executionMode) {
        auto minTimeUpstream = generateMinTimeUpstream(
            dependencies, restrictive_time_policy, mSourceId, mTimeDownstream.minFed, 0);
        DependencyInfo dependency;
        dependency.update(minTimeUpstream);
        auto upd_delayed = generateTimeRequest(dependency,
                                               mTimeDownstream.minFed,
                                               dependency.responseSequenceCounter);
        if (sendMessageFunction) {
            sendMessageFunction(upd_delayed);
        }
    }
    return (updateUpStream || updateDownStream);
}